

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int passwd_callback(char *buf,int num,int encrypting,void *password)

{
  int iVar1;
  size_t uznum;
  int iVar2;
  
  iVar2 = 0;
  if (password != (void *)0x0 && (-1 < num && encrypting == 0)) {
    uznum = strlen((char *)password);
    iVar1 = curlx_uztosi(uznum);
    iVar2 = 0;
    if (iVar1 < num) {
      memcpy(buf,password,(long)(iVar1 + 1));
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int passwd_callback(char *buf, int num, int encrypting,
                           void *password)
{
  DEBUGASSERT(0 == encrypting);

  if(!encrypting && num >= 0 && password) {
    int klen = curlx_uztosi(strlen((char *)password));
    if(num > klen) {
      memcpy(buf, password, klen + 1);
      return klen;
    }
  }
  return 0;
}